

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

bool __thiscall jrtplib::RTCPScheduler::IsTime(RTCPScheduler *this)

{
  RTPInternalSourceData *pRVar1;
  bool sender;
  RTPTime RVar2;
  RTPTime RVar3;
  double dVar4;
  
  if (this->firstcall == true) {
    this->firstcall = false;
    RVar2 = RTPTime::CurrentTime();
    (this->prevrtcptime).m_t = RVar2.m_t;
    this->pmembers = this->sources->activecount;
    CalculateNextRTCPTime(this);
  }
  else {
    RVar2 = RTPTime::CurrentTime();
    if ((this->nextrtcptime).m_t <= RVar2.m_t) {
      if (this->byescheduled == false) {
        pRVar1 = this->sources->owndata;
        if (pRVar1 == (RTPInternalSourceData *)0x0) {
          sender = false;
        }
        else {
          sender = (pRVar1->super_RTPSourceData).issender;
        }
        RVar3 = CalculateTransmissionInterval(this,sender);
      }
      else {
        RVar3 = CalculateBYETransmissionInterval(this);
      }
      dVar4 = RVar3.m_t + (this->prevrtcptime).m_t;
      if (dVar4 <= RVar2.m_t) {
        this->byescheduled = false;
        (this->prevrtcptime).m_t = RVar2.m_t;
        this->pmembers = this->sources->activecount;
        CalculateNextRTCPTime(this);
        return true;
      }
      (this->nextrtcptime).m_t = dVar4;
      this->pmembers = this->sources->activecount;
    }
  }
  return false;
}

Assistant:

bool RTCPScheduler::IsTime()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return false;
	}

	RTPTime currenttime = RTPTime::CurrentTime();

//	// TODO: for debugging
//	double diff = nextrtcptime.GetDouble() - currenttime.GetDouble();
//
//	std::cout << "Delay till next RTCP interval: " << diff << std::endl;
	
	if (currenttime < nextrtcptime) // timer has not yet expired
		return false;

	RTPTime checktime(0,0);
	
	if (!byescheduled)
	{
		bool aresender = false;
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
			aresender = srcdat->IsSender();
		
		checktime = CalculateTransmissionInterval(aresender);
	}
	else
		checktime = CalculateBYETransmissionInterval();
	
//	std::cout << "Calculated checktime: " << checktime.GetDouble() << std::endl;
	
	checktime += prevrtcptime;
	
	if (checktime <= currenttime) // Okay
	{
		byescheduled = false;
		prevrtcptime = currenttime;
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
		return true;
	}

//	std::cout << "New delay: " << nextrtcptime.GetDouble() - currenttime.GetDouble() << std::endl;
	
	nextrtcptime = checktime;
	pmembers = sources.GetActiveMemberCount();
	
	return false;
}